

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int SDL_SetGamma(float red,float green,float blue)

{
  int iVar1;
  Uint16 local_618 [4];
  Uint16 blue_ramp [256];
  Uint16 green_ramp [256];
  Uint16 red_ramp [256];
  float blue_local;
  float green_local;
  float red_local;
  
  (*SDL20_CalculateGammaRamp)(red,green_ramp + 0xfc);
  if ((green != red) || (NAN(green) || NAN(red))) {
    (*SDL20_CalculateGammaRamp)(green,blue_ramp + 0xfc);
  }
  else {
    (*SDL20_memcpy)(blue_ramp + 0xfc,green_ramp + 0xfc,0x200);
  }
  if ((blue != red) || (NAN(blue) || NAN(red))) {
    if ((blue != green) || (NAN(blue) || NAN(green))) {
      (*SDL20_CalculateGammaRamp)(blue,local_618);
    }
    else {
      (*SDL20_memcpy)(local_618,blue_ramp + 0xfc,0x200);
    }
  }
  else {
    (*SDL20_memcpy)(local_618,green_ramp + 0xfc,0x200);
  }
  iVar1 = (*SDL20_SetWindowGammaRamp)(VideoWindow20,green_ramp + 0xfc,blue_ramp + 0xfc,local_618);
  return iVar1;
}

Assistant:

SDLCALL
SDL_SetGamma(float red, float green, float blue)
{
    Uint16 red_ramp[256];
    Uint16 green_ramp[256];
    Uint16 blue_ramp[256];

    SDL20_CalculateGammaRamp(red, red_ramp);
    if (green == red) {
        SDL20_memcpy(green_ramp, red_ramp, sizeof(red_ramp));
    } else {
        SDL20_CalculateGammaRamp(green, green_ramp);
    }
    if (blue == red) {
        SDL20_memcpy(blue_ramp, red_ramp, sizeof(red_ramp));
    } else if (blue == green) {
        SDL20_memcpy(blue_ramp, green_ramp, sizeof(green_ramp));
    } else {
        SDL20_CalculateGammaRamp(blue, blue_ramp);
    }

    return SDL20_SetWindowGammaRamp(VideoWindow20, red_ramp, green_ramp, blue_ramp);
}